

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O0

void __thiscall CMU462::Application::setGhosted(Application *this,bool isGhosted)

{
  bool bVar1;
  reference ppSVar2;
  byte in_SIL;
  set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
  *in_RDI;
  SceneObject *object;
  iterator __end1;
  iterator __begin1;
  set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
  *__range1;
  SceneObject *in_stack_ffffffffffffffd0;
  _Self local_28;
  _Self in_stack_ffffffffffffffe0;
  Scene *in_stack_ffffffffffffffe8;
  
  DynamicScene::Selection::clear((Selection *)in_stack_ffffffffffffffe0._M_node);
  DynamicScene::Scene::removeObject
            (in_stack_ffffffffffffffe8,(SceneObject *)in_stack_ffffffffffffffe0._M_node);
  *(byte *)((long)&in_RDI[0x17]._M_t._M_impl.super__Rb_tree_header._M_header._M_left + 2) =
       in_SIL & 1;
  std::
  set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
  ::begin(in_RDI);
  local_28._M_node =
       (_Base_ptr)
       std::
       set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
       ::end(in_RDI);
  while( true ) {
    bVar1 = std::operator!=((_Self *)&stack0xffffffffffffffe0,&local_28);
    if (!bVar1) break;
    ppSVar2 = std::_Rb_tree_const_iterator<CMU462::DynamicScene::SceneObject_*>::operator*
                        ((_Rb_tree_const_iterator<CMU462::DynamicScene::SceneObject_*> *)
                         in_stack_ffffffffffffffd0);
    in_stack_ffffffffffffffd0 = *ppSVar2;
    in_stack_ffffffffffffffd0->isGhosted = (bool)(in_SIL & 1);
    std::_Rb_tree_const_iterator<CMU462::DynamicScene::SceneObject_*>::operator++
              ((_Rb_tree_const_iterator<CMU462::DynamicScene::SceneObject_*> *)
               in_stack_ffffffffffffffd0);
  }
  return;
}

Assistant:

void Application::setGhosted(bool isGhosted) {
  scene->selected.clear();
  scene->removeObject(scene->elementTransform);

  this->isGhosted = isGhosted;
  for (auto object : scene->objects) {
    object->isGhosted = isGhosted;
  }
}